

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::CombinedImageSamplerDrefHandler::handle
          (CombinedImageSamplerDrefHandler *this,Op opcode,uint32_t *args,uint32_t param_3)

{
  uint32_t param_3_local;
  uint32_t *args_local;
  Op opcode_local;
  CombinedImageSamplerDrefHandler *this_local;
  
  if ((((opcode - OpImageSampleDrefImplicitLod < 2) ||
       (opcode - OpImageSampleProjDrefImplicitLod < 2)) || (opcode == OpImageDrefGather)) ||
     (((opcode - OpImageSparseSampleDrefImplicitLod < 2 ||
       (opcode - OpImageSparseSampleProjDrefImplicitLod < 2)) || (opcode == OpImageSparseDrefGather)
      ))) {
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(&this->dref_combined_samplers,args + 2);
  }
  return true;
}

Assistant:

bool Compiler::CombinedImageSamplerDrefHandler::handle(spv::Op opcode, const uint32_t *args, uint32_t)
{
	// Mark all sampled images which are used with Dref.
	switch (opcode)
	{
	case OpImageSampleDrefExplicitLod:
	case OpImageSampleDrefImplicitLod:
	case OpImageSampleProjDrefExplicitLod:
	case OpImageSampleProjDrefImplicitLod:
	case OpImageSparseSampleProjDrefImplicitLod:
	case OpImageSparseSampleDrefImplicitLod:
	case OpImageSparseSampleProjDrefExplicitLod:
	case OpImageSparseSampleDrefExplicitLod:
	case OpImageDrefGather:
	case OpImageSparseDrefGather:
		dref_combined_samplers.insert(args[2]);
		return true;

	default:
		break;
	}

	return true;
}